

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O2

bool __thiscall Parse::SMTLIB2::parseAsSortDefinition(SMTLIB2 *this,string *id,LExpr *exp)

{
  ParseResult *pPVar1;
  bool bVar2;
  SortDefinition *pSVar3;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *elem;
  TermList TVar4;
  pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*> elem_00;
  pair<Kernel::TermList,_Kernel::TermList> val;
  TermList arg;
  LispListReader argRdr;
  undefined1 local_c8 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string pId;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&pId,id,"()");
  std::__cxx11::string::string((string *)&local_90,(string *)&pId);
  pSVar3 = Lib::
           DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parse::SMTLIB2::SortDefinition,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findPtr(&this->_sortDefinitions,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (pSVar3 != (SortDefinition *)0x0) {
    elem = (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)Lib::
              DHMap<std::__cxx11::string,std::pair<Kernel::TermList,Kernel::TermList>,Lib::DefaultHash,Lib::DefaultHash2>
              ::operator_new(0x28);
    elem->_timestamp = 1;
    elem->_size = 0;
    elem->_deleted = 0;
    elem->_capacityIndex = 0;
    elem->_capacity = 0;
    *(undefined8 *)&elem->_nextExpansionOccupancy = 0;
    *(undefined8 *)((long)&elem->_entries + 4) = 0;
    *(undefined4 *)((long)&elem->_afterLast + 4) = 0;
    argRdr.it._lst = (Iterator)pSVar3->args;
    while (argRdr.it._lst != (List<Shell::LispParser::Expression_*> *)0x0) {
      pPVar1 = (this->_results)._cursor;
      if (pPVar1 == (this->_results)._stack) {
LAB_004de421:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_c8,"sort definition",(allocator<char> *)&arg);
        complainAboutArgShortageOrWrongSorts(this,(string *)local_c8,exp);
      }
      bVar2 = ParseResult::isSeparator(pPVar1 + -1);
      if (bVar2) goto LAB_004de421;
      arg._content = 2;
      Lib::Stack<Parse::SMTLIB2::ParseResult>::pop((ParseResult *)local_c8,&this->_results);
      ParseResult::asTerm((ParseResult *)local_c8,&arg);
      Kernel::AtomicSort::superSort();
      std::__cxx11::string::~string((string *)(local_c8 + 0x10));
      Shell::LispListReader::readAtom_abi_cxx11_((string *)local_c8,&argRdr);
      std::__cxx11::string::string((string *)&local_50,(string *)local_c8);
      TVar4 = Kernel::AtomicSort::superSort();
      val.second._content = TVar4._content;
      val.first._content = arg._content;
      Lib::
      DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
      ::insert(elem,&local_50,val);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)local_c8);
    }
    Lib::
    Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
    ::push(&this->_scopes,elem);
    Lib::Stack<std::pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*>_>::push
              (&this->_todo,
               (pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*>)ZEXT816(0xc));
    elem_00.second = pSVar3->body;
    elem_00._0_8_ = 1;
    Lib::Stack<std::pair<Parse::SMTLIB2::ParseOperation,_Shell::LispParser::Expression_*>_>::push
              (&this->_todo,elem_00);
  }
  std::__cxx11::string::~string((string *)&pId);
  return pSVar3 != (SortDefinition *)0x0;
}

Assistant:

bool SMTLIB2::parseAsSortDefinition(const std::string& id,LExpr* exp)
{
  std::string pId = id + TYPECON_POSTFIX;
  auto def = _sortDefinitions.findPtr(pId);
  if (!def) {
    return false;
  }
  TermLookup* lookup = new TermLookup();

  LispListReader argRdr(def->args);

  while (argRdr.hasNext()) {
    if (_results.isEmpty() || _results.top().isSeparator()) {
      complainAboutArgShortageOrWrongSorts("sort definition",exp);
    }
    TermList arg;
    ALWAYS(_results.pop().asTerm(arg) == AtomicSort::superSort());
    const std::string& argName = argRdr.readAtom();
    // TODO: could check if the same string names more than one argument positions
    // the following just takes the first and ignores the others
    lookup->insert(argName,make_pair(arg,AtomicSort::superSort()));
  }

  _scopes.push(lookup);

  _todo.push(make_pair(PO_POP_LOOKUP,nullptr)); //schedule lookup deletion (see above)
  _todo.push(make_pair(PO_PARSE_SORT,def->body));

  return true;
}